

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

UA_StatusCode NodeId_copy(UA_NodeId *src,UA_NodeId *dst,UA_DataType *_)

{
  size_t sVar1;
  UA_Byte *pUVar2;
  undefined2 uVar3;
  UA_NodeIdType UVar4;
  UA_StatusCode UVar5;
  
  UVar5 = 0x80020000;
  switch(src->identifierType) {
  case UA_NODEIDTYPE_NUMERIC:
    (dst->identifier).string.data = (src->identifier).string.data;
    uVar3 = *(undefined2 *)&src->field_0x2;
    UVar4 = src->identifierType;
    sVar1 = (src->identifier).string.length;
    dst->namespaceIndex = src->namespaceIndex;
    *(undefined2 *)&dst->field_0x2 = uVar3;
    dst->identifierType = UVar4;
    (dst->identifier).string.length = sVar1;
    return 0;
  default:
    goto switchD_00125bc9_caseD_1;
  case UA_NODEIDTYPE_STRING:
    UVar5 = UA_String_copy(&(src->identifier).string,&(dst->identifier).string);
    break;
  case UA_NODEIDTYPE_GUID:
    pUVar2 = (src->identifier).string.data;
    (dst->identifier).string.length = (src->identifier).string.length;
    (dst->identifier).string.data = pUVar2;
    UVar5 = 0;
    break;
  case UA_NODEIDTYPE_BYTESTRING:
    UVar5 = UA_ByteString_copy(&(src->identifier).byteString,&(dst->identifier).byteString);
  }
  dst->namespaceIndex = src->namespaceIndex;
  dst->identifierType = src->identifierType;
switchD_00125bc9_caseD_1:
  return UVar5;
}

Assistant:

static UA_StatusCode
NodeId_copy(UA_NodeId const *src, UA_NodeId *dst, const UA_DataType *_) {
    UA_StatusCode retval = UA_STATUSCODE_GOOD;
    switch(src->identifierType) {
    case UA_NODEIDTYPE_NUMERIC:
        *dst = *src;
        return UA_STATUSCODE_GOOD;
    case UA_NODEIDTYPE_STRING:
        retval |= UA_String_copy(&src->identifier.string,
                                 &dst->identifier.string);
        break;
    case UA_NODEIDTYPE_GUID:
        retval |= UA_Guid_copy(&src->identifier.guid, &dst->identifier.guid);
        break;
    case UA_NODEIDTYPE_BYTESTRING:
        retval |= UA_ByteString_copy(&src->identifier.byteString,
                                     &dst->identifier.byteString);
        break;
    default:
        return UA_STATUSCODE_BADINTERNALERROR;
    }
    dst->namespaceIndex = src->namespaceIndex;
    dst->identifierType = src->identifierType;
    return retval;
}